

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::kernelVersion(void)

{
  long lVar1;
  int iVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  utsname u;
  QString *data;
  QByteArrayView *in_stack_fffffffffffffe60;
  undefined1 local_18e [126];
  QByteArrayView in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  memset(local_18e,0xaa,0x186);
  iVar2 = uname((utsname *)local_18e);
  if (iVar2 == 0) {
    QByteArrayView::QByteArrayView<65ul>(in_stack_fffffffffffffe60,(char (*) [65])data);
    QString::fromLatin1(in_stack_fffffffffffffef0);
  }
  else {
    QString::QString((QString *)0x25ac54);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::kernelVersion()
{
#ifdef Q_OS_WIN
    const auto osver = QOperatingSystemVersion::current();
    return QString::asprintf("%d.%d.%d",
                             osver.majorVersion(), osver.minorVersion(), osver.microVersion());
#else
    struct utsname u;
    if (uname(&u) == 0) {
#   ifdef Q_OS_VXWORKS
        // The string follows the pattern "Core Kernel version: w.x.y.z"
        auto versionStr = QByteArrayView(u.kernelversion);
        if (auto lastSpace = versionStr.lastIndexOf(' '); lastSpace != -1) {
            return QString::fromLatin1(versionStr.sliced(lastSpace + 1));
        }
#   else
        return QString::fromLatin1(u.release);
#   endif
    }
    return QString();
#endif
}